

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O1

void __thiscall
QtPromisePrivate::PromiseError::PromiseError<std::shared_ptr<int>>
          (PromiseError *this,shared_ptr<int> *value)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  void *__tmp;
  undefined8 *puVar2;
  
  (this->m_data)._M_exception_object = (void *)0x0;
  puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
  *puVar2 = (value->super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var1 = (value->super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  puVar2[1] = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  __cxa_throw(puVar2,&std::shared_ptr<int>::typeinfo,
              std::__shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>::~__shared_ptr);
}

Assistant:

PromiseError(const T& value)
    {
        try {
            throw value;
        } catch (...) {
            m_data = std::current_exception();
        }
    }